

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::WriteArray(ON_BinaryArchive *this,ON_SimpleArray<ON_2fVector> *a)

{
  int iVar1;
  bool bVar2;
  ON__INT32 i;
  
  iVar1 = a->m_count;
  i = 0;
  if (0 < iVar1) {
    i = iVar1;
  }
  bVar2 = WriteInt(this,i);
  if (bVar2 && 0 < iVar1) {
    bVar2 = WriteInt32(this,(ulong)(uint)(i * 2),(ON__INT32 *)a->m_a);
    return bVar2;
  }
  return bVar2;
}

Assistant:

bool
ON_BinaryArchive::WriteArray( const ON_SimpleArray<ON_2fVector>& a )
{
  int count = a.Count();
  if ( count < 0 )
    count = 0;
  bool rc = WriteInt( count );
  if ( rc && count > 0 ) {
    rc = WriteFloat( count*2, &a.Array()->x );
  }
  return rc;
}